

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<fd::AccuracyOrder>::add_generator
          (Generators<fd::AccuracyOrder> *this,AccuracyOrder *val)

{
  GeneratorWrapper<fd::AccuracyOrder> local_20;
  AccuracyOrder *local_18;
  AccuracyOrder *val_local;
  Generators<fd::AccuracyOrder> *this_local;
  
  local_18 = val;
  val_local = (AccuracyOrder *)this;
  value<fd::AccuracyOrder,fd::AccuracyOrder>((Generators *)&local_20,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>
            ((vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>>
              *)&this->m_generators,&local_20);
  GeneratorWrapper<fd::AccuracyOrder>::~GeneratorWrapper(&local_20);
  return;
}

Assistant:

void add_generator( T&& val ) {
            m_generators.emplace_back( value( CATCH_MOVE( val ) ) );
        }